

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvtBroadphase.cpp
# Opt level: O0

void __thiscall
btDbvtBroadphase::performDeferredRemoval(btDbvtBroadphase *this,btDispatcher *dispatcher)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  btBroadphasePair *a;
  undefined8 in_RSI;
  btBroadphasePairSortPredicate *in_RDI;
  bool hasOverlap;
  btDbvtProxy *pb;
  btDbvtProxy *pa;
  bool needsRemoval;
  bool isDuplicate;
  btBroadphasePair *pair;
  btBroadphasePair previousPair;
  int i;
  int invalidPair;
  btBroadphasePairArray *overlappingPairArray;
  btBroadphaseProxy *in_stack_ffffffffffffff70;
  btBroadphaseProxy *in_stack_ffffffffffffff78;
  btDbvtAabbMm *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  btBroadphaseProxy *in_stack_ffffffffffffff98;
  int newsize;
  btBroadphaseProxy *in_stack_ffffffffffffffa0;
  btBroadphasePair local_48;
  int local_24;
  int local_20;
  btAlignedObjectArray<btBroadphasePair> *local_18;
  undefined8 local_10;
  
  local_10 = in_RSI;
  uVar4 = (**(code **)(**(long **)(in_RDI + 0xe0) + 0x70))();
  if ((uVar4 & 1) != 0) {
    local_18 = (btAlignedObjectArray<btBroadphasePair> *)
               (**(code **)(**(long **)(in_RDI + 0xe0) + 0x38))();
    btAlignedObjectArray<btBroadphasePair>::quickSort<btBroadphasePairSortPredicate>
              ((btAlignedObjectArray<btBroadphasePair> *)in_stack_ffffffffffffff70,in_RDI);
    local_20 = 0;
    btBroadphasePair::btBroadphasePair(&local_48);
    local_48.m_pProxy0 = (btBroadphaseProxy *)0x0;
    local_48.m_pProxy1 = (btBroadphaseProxy *)0x0;
    local_48.m_algorithm = (btCollisionAlgorithm *)0x0;
    local_24 = 0;
    while( true ) {
      iVar1 = local_24;
      iVar3 = btAlignedObjectArray<btBroadphasePair>::size(local_18);
      newsize = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      if (iVar3 <= iVar1) break;
      a = btAlignedObjectArray<btBroadphasePair>::operator[](local_18,local_24);
      bVar2 = operator==(a,&local_48);
      local_48.m_pProxy0 = a->m_pProxy0;
      local_48.m_pProxy1 = a->m_pProxy1;
      local_48.m_algorithm = a->m_algorithm;
      local_48.field_3 = a->field_3;
      if (bVar2) {
        bVar2 = true;
      }
      else {
        in_stack_ffffffffffffffa0 = a->m_pProxy0;
        in_stack_ffffffffffffff98 = a->m_pProxy1;
        in_stack_ffffffffffffff97 =
             Intersect(in_stack_ffffffffffffff80,(btDbvtAabbMm *)in_stack_ffffffffffffff78);
        bVar2 = !(bool)in_stack_ffffffffffffff97;
      }
      if (bVar2) {
        (**(code **)(**(long **)(in_RDI + 0xe0) + 0x40))(*(long **)(in_RDI + 0xe0),a,local_10);
        a->m_pProxy0 = (btBroadphaseProxy *)0x0;
        a->m_pProxy1 = (btBroadphaseProxy *)0x0;
        local_20 = local_20 + 1;
      }
      local_24 = local_24 + 1;
    }
    btAlignedObjectArray<btBroadphasePair>::quickSort<btBroadphasePairSortPredicate>
              ((btAlignedObjectArray<btBroadphasePair> *)in_stack_ffffffffffffff70,in_RDI);
    btAlignedObjectArray<btBroadphasePair>::size(local_18);
    btBroadphasePair::btBroadphasePair((btBroadphasePair *)&stack0xffffffffffffff70);
    btAlignedObjectArray<btBroadphasePair>::resize
              ((btAlignedObjectArray<btBroadphasePair> *)in_stack_ffffffffffffffa0,newsize,
               (btBroadphasePair *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  }
  return;
}

Assistant:

void btDbvtBroadphase::performDeferredRemoval(btDispatcher* dispatcher)
{

	if (m_paircache->hasDeferredRemoval())
	{

		btBroadphasePairArray&	overlappingPairArray = m_paircache->getOverlappingPairArray();

		//perform a sort, to find duplicates and to sort 'invalid' pairs to the end
		overlappingPairArray.quickSort(btBroadphasePairSortPredicate());

		int invalidPair = 0;

		
		int i;

		btBroadphasePair previousPair;
		previousPair.m_pProxy0 = 0;
		previousPair.m_pProxy1 = 0;
		previousPair.m_algorithm = 0;
		
		
		for (i=0;i<overlappingPairArray.size();i++)
		{
		
			btBroadphasePair& pair = overlappingPairArray[i];

			bool isDuplicate = (pair == previousPair);

			previousPair = pair;

			bool needsRemoval = false;

			if (!isDuplicate)
			{
				//important to perform AABB check that is consistent with the broadphase
				btDbvtProxy*		pa=(btDbvtProxy*)pair.m_pProxy0;
				btDbvtProxy*		pb=(btDbvtProxy*)pair.m_pProxy1;
				bool hasOverlap = Intersect(pa->leaf->volume,pb->leaf->volume);

				if (hasOverlap)
				{
					needsRemoval = false;
				} else
				{
					needsRemoval = true;
				}
			} else
			{
				//remove duplicate
				needsRemoval = true;
				//should have no algorithm
				btAssert(!pair.m_algorithm);
			}
			
			if (needsRemoval)
			{
				m_paircache->cleanOverlappingPair(pair,dispatcher);

				pair.m_pProxy0 = 0;
				pair.m_pProxy1 = 0;
				invalidPair++;
			} 
			
		}

		//perform a sort, to sort 'invalid' pairs to the end
		overlappingPairArray.quickSort(btBroadphasePairSortPredicate());
		overlappingPairArray.resize(overlappingPairArray.size() - invalidPair);
	}
}